

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O1

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_AsmOperand(SyntaxDumper *this,ExtGNU_AsmOperandSyntax *node)

{
  SyntaxToken local_50;
  
  SyntaxNode::tokenAtIndex(&local_50,&node->super_SyntaxNode,node->openBracketTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->oprdName_);
  SyntaxNode::tokenAtIndex(&local_50,&node->super_SyntaxNode,node->closeBracketTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->constr_);
  SyntaxNode::tokenAtIndex(&local_50,&node->super_SyntaxNode,node->openParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->expr_);
  SyntaxNode::tokenAtIndex(&local_50,&node->super_SyntaxNode,node->closeParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_AsmOperand(const ExtGNU_AsmOperandSyntax* node) override
    {
        terminal(node->openBracketToken(), node);
        nonterminal(node->operandName());
        terminal(node->closeBracketToken(), node);
        nonterminal(node->constraint());
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->expression());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }